

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

char * choc::text::FloatToStringBuffer<float>::writeWithoutExponentGreaterThan1
                 (char *dest,uint32_t totalLength,uint32_t mantissaLength,int maxDecimalPlaces,int K
                 )

{
  undefined4 in_register_00000014;
  size_t __n;
  size_t extraout_RDX;
  int local_30;
  uint local_2c;
  int i_1;
  uint32_t i;
  int K_local;
  int maxDecimalPlaces_local;
  uint32_t mantissaLength_local;
  uint32_t totalLength_local;
  char *dest_local;
  
  __n = CONCAT44(in_register_00000014,mantissaLength);
  if (K < 0) {
    insertChar(dest + mantissaLength,totalLength - mantissaLength,'.',1);
    if (K + maxDecimalPlaces < 0) {
      for (local_30 = mantissaLength + maxDecimalPlaces; (int)(mantissaLength + 1) < local_30;
          local_30 = local_30 + -1) {
        if (dest[local_30] != '0') {
          return dest + (local_30 + 1);
        }
      }
      dest_local = dest + (mantissaLength + 2);
    }
    else {
      dest_local = dest + (totalLength + 1);
    }
  }
  else {
    _mantissaLength_local = dest + totalLength;
    for (local_2c = totalLength; local_2c < mantissaLength; local_2c = local_2c + 1) {
      _mantissaLength_local = (char *)write((int)_mantissaLength_local,(void *)0x30,__n);
      __n = extraout_RDX;
    }
    dest_local = write<char>(_mantissaLength_local,'.','0');
  }
  return dest_local;
}

Assistant:

static char* writeWithoutExponentGreaterThan1 (char* dest, uint32_t totalLength, uint32_t mantissaLength, int maxDecimalPlaces, int K)
    {
        if (K >= 0)
        {
            dest += totalLength;

            for (auto i = totalLength; i < mantissaLength; ++i)
                dest = write (dest, '0');

            return write (dest, '.', '0');
        }

        insertChar (dest + mantissaLength, totalLength - mantissaLength, '.', 1);

        if (K + maxDecimalPlaces >= 0)
            return dest + (totalLength + 1);

        for (auto i = static_cast<int> (mantissaLength) + maxDecimalPlaces; i > static_cast<int> (mantissaLength + 1); --i)
            if (dest[i] != '0')
                return dest + (i + 1);

        return dest + (mantissaLength + 2);
    }